

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O1

int Associate_Fields(FORM *form,FIELD **fields)

{
  int iVar1;
  
  iVar1 = Connect_Fields(form,fields);
  if (iVar1 == 0) {
    if (form->maxpage < 1) {
      form->curpage = -1;
      form->current = (FIELD *)0x0;
    }
    else {
      form->curpage = 0;
      form_driver(form,-0x470f0);
    }
  }
  return iVar1;
}

Assistant:

INLINE static int Associate_Fields(FORM  *form, FIELD **fields)
{
  int res = Connect_Fields(form,fields);
  if (res == E_OK)
    {
      if (form->maxpage>0)
	{
	  form->curpage = 0;
	  form_driver(form,FIRST_ACTIVE_MAGIC);
	}
      else
	{
	  form->curpage = -1;
	  form->current = (FIELD *)0;
	} 
    }
  return(res);
}